

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31sVertexAttributeBindingTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Stress::anon_unknown_0::BindVertexBufferCase::deinit(BindVertexBufferCase *this)

{
  ShaderProgram *this_00;
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  BindVertexBufferCase *this_local;
  
  if (this->m_buffer != 0) {
    pRVar2 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
    iVar1 = (*pRVar2->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x438))(1,&this->m_buffer);
    this->m_buffer = 0;
  }
  this_00 = this->m_program;
  if (this_00 != (ShaderProgram *)0x0) {
    glu::ShaderProgram::~ShaderProgram(this_00);
    operator_delete(this_00,0xd0);
  }
  this->m_program = (ShaderProgram *)0x0;
  return;
}

Assistant:

void BindVertexBufferCase::deinit (void)
{
	if (m_buffer)
	{
		m_context.getRenderContext().getFunctions().deleteBuffers(1, &m_buffer);
		m_buffer = 0;
	}

	delete m_program;
	m_program = DE_NULL;
}